

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ukf.cpp
# Opt level: O0

void __thiscall UKF::UKF(UKF *this)

{
  double dVar1;
  int iVar2;
  Scalar *pSVar3;
  double weight;
  int i;
  double weight_0;
  ConstantReturnType local_60;
  ConstantReturnType local_48;
  Matrix<double,__1,_1,_0,__1,_1> local_30 [2];
  UKF *local_10;
  UKF *this_local;
  
  this->_vptr_UKF = (_func_int **)&PTR__UKF_0016dd38;
  local_10 = this;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&this->x_);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(&this->P_);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::Matrix(&this->Xsig_pred_);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(&this->weights_);
  this->is_initialized_ = false;
  this->n_x_ = 5;
  this->n_aug_ = 7;
  this->n_zrad_ = 3;
  this->n_zlas_ = 2;
  this->lambda_ = (double)(3 - this->n_aug_);
  this->use_laser_ = true;
  this->use_radar_ = true;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix(local_30,5);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=(&this->x_,local_30);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(local_30);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Zero(&local_48,5,5);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
            ((Matrix<double,_1,_1,0,_1,_1> *)&this->P_,
             (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_48);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Zero
            (&local_60,(long)this->n_x_,(long)(this->n_aug_ * 2 + 1));
  Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
            ((Matrix<double,_1,_1,0,_1,_1> *)&this->Xsig_pred_,
             (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_60);
  this->previous_timestamp_ = 0;
  this->std_a_ = 3.0;
  this->std_yawdd_ = 0.7;
  this->std_laspx_ = 0.15;
  this->std_laspy_ = 0.15;
  this->std_radr_ = 0.3;
  this->std_radphi_ = 0.03;
  this->std_radrd_ = 0.35;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero
            ((ConstantReturnType *)&weight_0,(long)(this->n_aug_ * 2 + 1));
  Eigen::Matrix<double,-1,1,0,-1,1>::operator=
            ((Matrix<double,_1,1,0,_1,1> *)&this->weights_,
             (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&weight_0);
  this->NIS_radar_ = 0.0;
  this->NIS_laser_ = 0.0;
  dVar1 = this->lambda_;
  iVar2 = this->n_aug_;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&this->weights_,
                      0);
  *pSVar3 = dVar1 / (dVar1 + (double)iVar2);
  for (weight._4_4_ = 1; weight._4_4_ < this->n_aug_ * 2 + 1; weight._4_4_ = weight._4_4_ + 1) {
    iVar2 = this->n_aug_;
    dVar1 = this->lambda_;
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                        &this->weights_,(long)weight._4_4_);
    *pSVar3 = 0.5 / ((double)iVar2 + dVar1);
  }
  return;
}

Assistant:

UKF::UKF() {
  // Set initialization to false initially
  is_initialized_  = false;

  ///* State dimension
  n_x_ = 5;

  ///* Augmented state dimension
  n_aug_ = 7;

  //* radar measurement dimension
  n_zrad_ = 3;

  //* radar measurement dimension
  n_zlas_ = 2;

  ///* Sigma point spreading parameter
  lambda_ = 3 - n_aug_;

  // if this is false, laser measurements will be ignored (except during init)
  use_laser_ = true;

  // if this is false, radar measurements will be ignored (except during init)
  use_radar_ = true;

  // initial state vector
  x_ = VectorXd(5);

  // initial covariance matrix
  P_ = MatrixXd::Zero(5, 5);

  // initialize the sigma points matrix with zeroes
  Xsig_pred_ = MatrixXd::Zero(n_x_, 2 * n_aug_ + 1);

  ///* time when the state is true, in us
  previous_timestamp_ = 0;

  // Process noise standard deviation longitudinal acceleration in m/s^2
  std_a_ = 3;

  // Process noise standard deviation yaw acceleration in rad/s^2
  std_yawdd_ = 0.7;

  // Laser measurement noise standard deviation position1 in m
  std_laspx_ = 0.15;

  // Laser measurement noise standard deviation position2 in m
  std_laspy_ = 0.15;

  // Radar measurement noise standard deviation radius in m
  std_radr_ = 0.3;

  // Radar measurement noise standard deviation angle in rad
  std_radphi_ = 0.03;

  // Radar measurement noise standard deviation radius change in m/s
  std_radrd_ = 0.35;

  ///* Weights of sigma points
  weights_ = VectorXd::Zero(2*n_aug_+1);

  ///* the current NIS for radar
  NIS_radar_ = 0.0;

  ///* the current NIS for laser
  NIS_laser_ = 0.0;

  // set weights
  double weight_0 = lambda_/(lambda_+n_aug_);
  weights_(0) = weight_0;
  for (int i=1; i<2*n_aug_+1; i++) {  //2n+1 weights
    double weight = 0.5/(n_aug_+lambda_);
    weights_(i) = weight;
  }

  return;
  
}